

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O3

void __thiscall
TPZSkylMatrix<std::complex<float>_>::DecomposeColumn
          (TPZSkylMatrix<std::complex<float>_> *this,int64_t col,int64_t prevcol)

{
  complex<float> **ppcVar1;
  complex<float> *pcVar2;
  long lVar3;
  long lVar4;
  complex<float> *pcVar5;
  complex<float> *pcVar6;
  float fVar9;
  undefined8 uVar7;
  _ComplexT _Var8;
  undefined4 extraout_XMM0_Db;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  
  ppcVar1 = (this->fElem).fStore;
  pcVar2 = ppcVar1[prevcol];
  lVar4 = (prevcol - ((long)ppcVar1[prevcol + 1] - (long)pcVar2 >> 3)) + 1;
  lVar3 = (col - ((long)ppcVar1[col + 1] - (long)ppcVar1[col] >> 3)) + 1;
  if (lVar3 < lVar4) {
    lVar3 = lVar4;
  }
  if (prevcol < lVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"error condition\n",0x10);
    std::ostream::flush();
    return;
  }
  pcVar6 = ppcVar1[col] + (col - lVar3);
  if (prevcol == lVar3) {
    fVar12 = 0.0;
    fVar13 = 0.0;
  }
  else {
    lVar3 = prevcol * 8 + lVar3 * -8;
    fVar12 = 0.0;
    fVar13 = 0.0;
    do {
      pcVar5 = pcVar6;
      uVar7 = *(undefined8 *)((long)&pcVar2->_M_value + lVar3);
      fVar10 = *(float *)((long)&pcVar5->_M_value + 4);
      fVar9 = (float)((ulong)uVar7 >> 0x20);
      fVar11 = *(float *)&pcVar5->_M_value * (float)uVar7 - fVar9 * fVar10;
      fVar10 = *(float *)&pcVar5->_M_value * fVar9 + (float)uVar7 * fVar10;
      if ((NAN(fVar11)) && (NAN(fVar10))) {
        uVar7 = __mulsc3(uVar7,fVar9);
        fVar11 = (float)uVar7;
        fVar10 = (float)((ulong)uVar7 >> 0x20);
      }
      fVar12 = fVar12 + fVar11;
      fVar13 = fVar13 + fVar10;
      lVar3 = lVar3 + -8;
      pcVar6 = pcVar5 + -1;
    } while (lVar3 != 0);
    pcVar6 = pcVar5 + -1;
  }
  fVar12 = (float)pcVar6->_M_value - fVar12;
  fVar13 = (float)(pcVar6->_M_value >> 0x20) - fVar13;
  _Var8 = CONCAT44(fVar13,fVar12);
  pcVar6->_M_value = _Var8;
  if (pcVar2 == pcVar6) {
    fVar12 = csqrtf(fVar12);
    _Var8 = CONCAT44(extraout_XMM0_Db,fVar12);
  }
  else {
    _Var8 = __divsc3(_Var8,fVar13,(int)pcVar2->_M_value,*(undefined4 *)((long)&pcVar2->_M_value + 4)
                    );
  }
  pcVar6->_M_value = _Var8;
  return;
}

Assistant:

void TPZSkylMatrix<TVar>::DecomposeColumn(int64_t col, int64_t prevcol){
    TVar *ptrprev;     //Pointer to prev column
    TVar *ptrcol;      //Pointer to col column
    int64_t skprev, skcol; //prev and col Skyline height respectively
    int64_t minline;
    
    skprev = SkyHeight(prevcol);
    skcol = SkyHeight(col);
    
    ptrprev = Diag(prevcol);
    ptrcol = Diag(col);
    
    if((prevcol-skprev) > (col-skcol)){
        minline = prevcol - skprev;
    }else
    {
        minline = col - skcol;
    }
    if(minline > prevcol) {
        cout << "error condition\n";
        cout.flush();
        return;
    }
    TVar *run1 = ptrprev + (prevcol-minline);
    TVar *run2 = ptrcol + (col-minline);
    TVar sum = 0;
    
    while(run1 != ptrprev) sum += (*run1--)*(*run2--);
    *run2-=sum;
    if(run1 != run2){
        *run2 /= *run1;
    }else{
        *run2=sqrt(*run2);
    }
    
}